

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void bc_slist_free_full(bc_slist_t *l,bc_free_func_t free_func)

{
  bc_free_func_t p_Var1;
  bc_slist_t *tmp;
  bc_free_func_t free_func_local;
  bc_slist_t *l_local;
  
  free_func_local = (bc_free_func_t)l;
  while (free_func_local != (bc_free_func_t)0x0) {
    p_Var1 = *(bc_free_func_t *)free_func_local;
    if ((free_func != (bc_free_func_t)0x0) && (*(long *)(free_func_local + 8) != 0)) {
      (*free_func)(*(void **)(free_func_local + 8));
    }
    free(free_func_local);
    free_func_local = p_Var1;
  }
  return;
}

Assistant:

void
bc_slist_free_full(bc_slist_t *l, bc_free_func_t free_func)
{
    while (l != NULL) {
        bc_slist_t *tmp = l->next;
        if ((free_func != NULL) && (l->data != NULL))
            free_func(l->data);
        free(l);
        l = tmp;
    }
}